

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O2

void HTS_ignorm(double *c1,double *c2,int m,double g)

{
  ulong uVar1;
  double dVar2;
  
  if ((g != 0.0) || (NAN(g))) {
    dVar2 = pow(*c1,g);
    for (uVar1 = (ulong)(uint)m; 0 < (int)uVar1; uVar1 = uVar1 - 1) {
      c2[uVar1] = c1[uVar1] * dVar2;
    }
    dVar2 = (dVar2 + -1.0) / g;
  }
  else {
    HTS_movem(c1 + 1,c2 + 1,m);
    dVar2 = log(*c1);
  }
  *c2 = dVar2;
  return;
}

Assistant:

static void HTS_ignorm(double *c1, double *c2, int m, const double g)
{
   double k;
   if (g != 0.0) {
      k = pow(c1[0], g);
      for (; m >= 1; m--)
         c2[m] = k * c1[m];
      c2[0] = (k - 1.0) / g;
   } else {
      HTS_movem(&c1[1], &c2[1], m);
      c2[0] = log(c1[0]);
   }
}